

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

void P_DoCrunch(AActor *thing,FChangePosition *cpos)

{
  byte *pbVar1;
  uint kind;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  PClassActor *type;
  AActor *pAVar6;
  FSoundID local_58;
  FName local_54;
  DAngle local_50;
  DAngle local_48;
  DVector3 local_40;
  
  if (((thing != (AActor *)0x0) &&
      (iVar3 = (*(thing->super_DThinker).super_DObject._vptr_DObject[0x18])(),
      cpos != (FChangePosition *)0x0)) && ((char)iVar3 != '\0')) {
    cpos->nofit = true;
    if ((0 < cpos->crushchange) && (((byte)level.maptime & 3) == 0)) {
      local_54.Index = 0x90;
      local_48.Degrees = 0.0;
      iVar3 = P_DamageMobj(thing,(AActor *)0x0,(AActor *)0x0,cpos->crushchange,&local_54,0,&local_48
                          );
      if (((thing->flags2).Value & 0x18000000) == 0) {
        if (((thing->flags).Value & 0x80000) == 0) {
          if ((thing->super_DThinker).super_DObject.Class == (PClass *)0x0) {
            iVar4 = (**(thing->super_DThinker).super_DObject._vptr_DObject)(thing);
            (thing->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
          }
          kind = *(uint *)&(thing->super_DThinker).super_DObject.Class[1].super_PNativeStruct.
                           super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                           Conversions.Array;
          type = AActor::GetBloodType(thing,0);
          if (iVar3 < 1) {
            iVar3 = cpos->crushchange;
          }
          P_TraceBleed(iVar3,thing);
          if (type != (PClassActor *)0x0) {
            local_40.Z = thing->Height * 0.5 + (thing->__Pos).Z;
            local_40.X = (thing->__Pos).X;
            local_40.Y = (thing->__Pos).Y;
            pAVar6 = AActor::StaticSpawn(type,&local_40,ALLOW_REPLACE,false);
            iVar3 = FRandom::Random2(&pr_crunch);
            (pAVar6->Vel).X = (double)iVar3 * 0.0625;
            iVar3 = FRandom::Random2(&pr_crunch);
            (pAVar6->Vel).Y = (double)iVar3 * 0.0625;
            if ((kind != 0) && (((pAVar6->flags2).Value & 0x10000) == 0)) {
              pAVar6->Translation = kind >> 0x18 | 0x80000;
            }
            if (1 < cl_bloodtype.Value) {
              pbVar1 = (byte *)((long)&(pAVar6->renderflags).Value + 1);
              *pbVar1 = *pbVar1 | 0x80;
            }
          }
          uVar5 = FRandom::GenRand32(&M_Random);
          if (0 < cl_bloodtype.Value) {
            local_50.Degrees = (double)(int)((uVar5 & 0xff) - 0x80) * 1.40625;
            local_40.X = (thing->__Pos).X;
            local_40.Y = (thing->__Pos).Y;
            local_40.Z = thing->Height * 0.5 + (thing->__Pos).Z;
            P_DrawSplash2(0x20,&local_40,&local_50,2,kind);
          }
        }
        iVar3 = (thing->CrushPainSound).super_FSoundID.ID;
        if ((iVar3 != 0) && (bVar2 = S_GetSoundPlayingInfo(thing,iVar3), !bVar2)) {
          local_58.ID = (thing->CrushPainSound).super_FSoundID.ID;
          S_Sound(thing,2,&local_58,1.0,1.0);
        }
      }
    }
  }
  return;
}

Assistant:

void P_DoCrunch(AActor *thing, FChangePosition *cpos)
{
	if (!(thing && thing->Grind(true) && cpos)) return;
	cpos->nofit = true;

	if ((cpos->crushchange > 0) && !(level.maptime & 3))
	{
		int newdam = P_DamageMobj(thing, NULL, NULL, cpos->crushchange, NAME_Crush);

		// spray blood in a random direction
		if (!(thing->flags2&(MF2_INVULNERABLE | MF2_DORMANT)))
		{
			if (!(thing->flags&MF_NOBLOOD))
			{
				PalEntry bloodcolor = thing->GetBloodColor();
				PClassActor *bloodcls = thing->GetBloodType();
				
				P_TraceBleed (newdam > 0 ? newdam : cpos->crushchange, thing);
				if (bloodcls != NULL)
				{
					AActor *mo;

					mo = Spawn(bloodcls, thing->PosPlusZ(thing->Height / 2), ALLOW_REPLACE);

					mo->Vel.X = pr_crunch.Random2() / 16.;
					mo->Vel.Y = pr_crunch.Random2() / 16.;
					if (bloodcolor != 0 && !(mo->flags2 & MF2_DONTTRANSLATE))
					{
						mo->Translation = TRANSLATION(TRANSLATION_Blood, bloodcolor.a);
					}

					if (!(cl_bloodtype <= 1)) mo->renderflags |= RF_INVISIBLE;
				}

				DAngle an = (M_Random() - 128) * (360./256);
				if (cl_bloodtype >= 1)
				{
					P_DrawSplash2(32,  thing->PosPlusZ(thing->Height/2), an, 2, bloodcolor);
				}
			}
			if (thing->CrushPainSound != 0 && !S_GetSoundPlayingInfo(thing, thing->CrushPainSound))
			{
				S_Sound(thing, CHAN_VOICE, thing->CrushPainSound, 1.f, ATTN_NORM);
			}
		}
	}

	// keep checking (crush other things)
	return;
}